

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O1

CURLcode __thiscall
curlpp::internal::CurlHandle::executeSslCtxFunctor(CurlHandle *this,void *ssl_ctx)

{
  FunctorImpl<CURLcode,_utilspp::tl::TypeList<void_*,_utilspp::NullType>_> *pFVar1;
  CURLcode CVar2;
  CallbackExceptionBase *this_00;
  LogicError local_20;
  
  pFVar1 = (this->mSslFunctor).mImpl._M_ptr;
  if (pFVar1 == (FunctorImpl<CURLcode,_utilspp::tl::TypeList<void_*,_utilspp::NullType>_> *)0x0) {
    this_00 = (CallbackExceptionBase *)operator_new(0x20);
    LogicError::LogicError(&local_20,"Null write functor");
    CallbackExceptionBase::CallbackExceptionBase(this_00);
    *(undefined ***)&this_00->super_RuntimeError = &PTR__CallbackException_00133c90;
    std::logic_error::logic_error((logic_error *)(this_00 + 1),&local_20.super_logic_error);
    *(undefined ***)&this_00[1].super_RuntimeError = &PTR__LogicError_00133948;
    if (this->mException != (CallbackExceptionBase *)0x0) {
      (**(code **)(*(long *)&this->mException->super_RuntimeError + 8))();
    }
    this->mException = this_00;
    LogicError::~LogicError(&local_20);
    CVar2 = CURLE_ABORTED_BY_CALLBACK;
  }
  else {
    CVar2 = (*(code *)**(undefined8 **)pFVar1)();
  }
  return CVar2;
}

Assistant:

CURLcode 
CurlHandle::executeSslCtxFunctor(void * ssl_ctx)
{
	if (!mSslFunctor)
	{
		setException(new CallbackException<curlpp::LogicError>(curlpp::LogicError("Null write functor")));
		return CURLE_ABORTED_BY_CALLBACK;
	}

	try
	{
		return mSslFunctor(ssl_ctx);
	}

	catch(curlpp::CallbackExceptionBase * e)
	{
		setException(e);
	}

	catch(...)
	{
		setException(new CallbackException<curlpp::UnknowException>(curlpp::UnknowException()));
	}

	return CURLE_ABORTED_BY_CALLBACK;
}